

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MaxShaderCompileThreadsTest::iterate(MaxShaderCompileThreadsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  int local_24;
  long lStack_20;
  GLint intValue;
  Functions *gl;
  MaxShaderCompileThreadsTest *this_local;
  
  gl = (Functions *)this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_parallel_shader_compile");
  if (bVar1) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    lStack_20 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lStack_20 + 0xdb0))(0);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x9d);
    (**(code **)(lStack_20 + 0x868))(0x91b0,&local_24);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"getIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xa0);
    if (local_24 == 0) {
      (**(code **)(lStack_20 + 0xdb0))(0xffffffff);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"maxShaderCompilerThreadsARB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xa9);
      (**(code **)(lStack_20 + 0x868))(0x91b0,&local_24);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"getIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xac);
      if (local_24 == -1) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Failed to set maximum shader compiler threads.");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Failed to disable parallel shader compilation.");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MaxShaderCompileThreadsTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint intValue;

	gl.maxShaderCompilerThreadsARB(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	gl.getIntegerv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &intValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv");

	if (intValue != 0)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Failed to disable parallel shader compilation.");
		return STOP;
	}

	gl.maxShaderCompilerThreadsARB(0xFFFFFFFF);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	gl.getIntegerv(GL_MAX_SHADER_COMPILER_THREADS_ARB, &intValue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv");

	if (intValue != GLint(0xFFFFFFFF))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Failed to set maximum shader compiler threads.");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}